

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContextData.h
# Opt level: O1

void __thiscall
uWS::WebSocketContextData<true>::~WebSocketContextData(WebSocketContextData<true> *this)

{
  Loop *pLVar1;
  
  pLVar1 = Loop::get((void *)0x0);
  Loop::removePostHandler(pLVar1,this);
  pLVar1 = Loop::get((void *)0x0);
  Loop::removePreHandler(pLVar1,this);
  TopicTree::~TopicTree((TopicTree *)(this + 0xb8));
  (**(code **)(this + 0x90))(this + 0x90,3,this + 0x80,0x10,0,0);
  (**(code **)(this + 0x70))(this + 0x70,3,this + 0x60,0x10,0,0);
  (**(code **)(this + 0x50))(this + 0x50,3,this + 0x40,0x10,0,0);
  (**(code **)(this + 0x30))(this + 0x30,3,this + 0x20,0x10,0,0);
  (**(code **)(this + 0x10))(this + 0x10,3,this,0x10,0,0);
  return;
}

Assistant:

~WebSocketContextData() {
        /* We must unregister any loop post handler here */
        Loop::get()->removePostHandler(this);
        Loop::get()->removePreHandler(this);
    }